

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

uint32_t u_getUnicodeProperties_63(UChar32 c,int32_t column)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint16_t vecIndex;
  int32_t column_local;
  UChar32 c_local;
  
  if (column < 3) {
    uVar1 = c >> 5;
    if ((uint)c < 0xd800) {
      local_24 = (uint)propsVectorsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar2 = 0;
        if (c < 0xdc00) {
          iVar2 = 0x140;
        }
        local_28 = (uint)propsVectorsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < 0x110000) {
            local_30 = (uint)propsVectorsTrie_index
                             [(int)((uint)propsVectorsTrie_index[(c >> 0xb) + 0x820] +
                                   (uVar1 & 0x3f))] * 4 + (c & 0x1fU);
          }
          else {
            local_30 = 0x7538;
          }
          local_2c = local_30;
        }
        else {
          local_2c = 0x13d4;
        }
        local_28 = local_2c;
      }
      local_24 = local_28;
    }
    column_local = propsVectors[(int)((uint)propsVectorsTrie_index[local_24] + column)];
  }
  else {
    column_local = 0;
  }
  return column_local;
}

Assistant:

U_CFUNC uint32_t
u_getUnicodeProperties(UChar32 c, int32_t column) {
    U_ASSERT(column>=0);
    if(column>=propsVectorsColumns) {
        return 0;
    } else {
        uint16_t vecIndex=UTRIE2_GET16(&propsVectorsTrie, c);
        return propsVectors[vecIndex+column];
    }
}